

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)3>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  pointer pdVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  int iVar11;
  size_type sVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  size_type __n;
  pointer piVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  Data2D<int> dagUp;
  SplitDirections split;
  int local_194;
  allocator_type local_161;
  pointer local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  pointer local_140;
  long local_138;
  long local_130;
  long local_128;
  vector<double,_std::allocator<double>_> local_120;
  pointer local_108;
  long local_100;
  long local_f8;
  size_t local_f0;
  ulong local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  Data2D<int> local_98;
  SplitDirections local_70;
  Data2D<int> *local_40;
  ulong local_38;
  
  iVar6 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar6;
  sVar10 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_98.stride = CONCAT44(local_98.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_148 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_70.job_directions,sVar10 * __n,(value_type_conflict3 *)&local_98,
             (allocator_type *)&local_130);
  local_108 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  piVar22 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar10;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_f0 = sVar10;
    local_40 = __return_storage_ptr__;
    getNormalization(&local_b0,this);
    uVar9 = 1;
    if (output == -1) {
      uVar9 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_138 = (long)(int)uVar9;
    local_158 = (double *)0x0;
    local_160 = (pointer)0x0;
    if (local_148 == (double *)0x0) {
      local_98.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_70,local_138 * __n,
                 (value_type_conflict2 *)&local_98,(allocator_type *)&local_130);
      local_148 = (double *)
                  local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_158 = (double *)
                  local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_160 = local_70.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    }
    auVar5 = _DAT_001ca0b0;
    auVar4 = _DAT_001ca070;
    auVar3 = _DAT_001ca060;
    if (criteria < refine_direction_selective) {
      if (0 < iVar6) {
        sVar10 = (this->surpluses).stride;
        pdVar1 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar22 = (pointer)((long)piVar22 + 0xc);
        sVar12 = 0;
        do {
          lVar13 = sVar10 * sVar12;
          if (output == -1) {
            lVar17 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar17) {
              bVar23 = true;
              lVar8 = 0;
              do {
                while (bVar23) {
                  dVar25 = (ABS(pdVar1[lVar13 + lVar8]) * (local_148 + sVar12 * local_138)[lVar8]) /
                           local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8];
                  bVar23 = dVar25 <= tolerance;
                  lVar8 = lVar8 + 1;
                  if (lVar8 == lVar17) goto LAB_001a4735;
                }
                lVar8 = lVar8 + 1;
                bVar23 = false;
              } while (lVar8 != lVar17);
              goto LAB_001a479a;
            }
          }
          else {
            dVar25 = (ABS(pdVar1[lVar13 + output]) * local_148[sVar12 * local_138]) /
                     local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output];
LAB_001a4735:
            if (tolerance < dVar25) {
LAB_001a479a:
              lVar13 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
              if (0 < lVar13) {
                uVar14 = lVar13 + 0x3fffffffffffffff;
                uVar15 = uVar14 & 0x3fffffffffffffff;
                auVar26._8_4_ = (int)uVar15;
                auVar26._0_8_ = uVar15;
                auVar26._12_4_ = (int)(uVar15 >> 0x20);
                auVar26 = auVar26 ^ auVar3;
                lVar13 = 0;
                do {
                  auVar27._8_4_ = (int)lVar13;
                  auVar27._0_8_ = lVar13;
                  auVar27._12_4_ = (int)((ulong)lVar13 >> 0x20);
                  auVar28 = (auVar27 | auVar4) ^ auVar3;
                  iVar6 = auVar26._4_4_;
                  if ((bool)(~(iVar6 < auVar28._4_4_ ||
                              auVar26._0_4_ < auVar28._0_4_ && auVar28._4_4_ == iVar6) & 1)) {
                    piVar22[lVar13 + -3] = 1;
                  }
                  if (auVar28._12_4_ <= auVar26._12_4_ &&
                      (auVar28._8_4_ <= auVar26._8_4_ || auVar28._12_4_ != auVar26._12_4_)) {
                    piVar22[lVar13 + -2] = 1;
                  }
                  auVar27 = (auVar27 | auVar5) ^ auVar3;
                  iVar29 = auVar27._4_4_;
                  if (iVar29 <= iVar6 && (iVar29 != iVar6 || auVar27._0_4_ <= auVar26._0_4_)) {
                    piVar22[lVar13 + -1] = 1;
                    piVar22[lVar13] = 1;
                  }
                  lVar13 = lVar13 + 4;
                } while ((uVar15 - ((uint)uVar14 & 3)) + 4 != lVar13);
              }
            }
          }
          sVar12 = sVar12 + 1;
          piVar22 = piVar22 + local_f0;
        } while (sVar12 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_98,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_70,mset);
      iVar6 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_70);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_c8,__n,(allocator_type *)&local_130);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e0,(long)iVar6,(allocator_type *)&local_130);
      if (0 < (int)((ulong)((long)local_70.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_70.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_f8 = (long)output;
        lVar13 = 0;
        local_150 = (double *)piVar22;
        do {
          lVar17 = (long)*(int *)((long)local_70.job_directions.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar13 * 4);
          local_140 = local_70.job_pnts.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar13].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
          uVar14 = (ulong)((long)local_70.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)local_140) >> 2;
          local_130 = local_138;
          uVar7 = (uint)uVar14;
          local_128 = (long)(int)uVar7;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_120,local_128 * local_138,&local_161);
          piVar22 = local_140;
          local_e8 = uVar14;
          if (output == -1) {
            if (0 < (int)uVar7) {
              uVar14 = 0;
              local_194 = 0;
              local_100 = lVar13;
              do {
                lVar13 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                if (0 < lVar13) {
                  memmove(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + local_130 * uVar14,
                          (this->super_BaseCanonicalGrid).values.values.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)piVar22[uVar14] * (this->super_BaseCanonicalGrid).values.num_outputs
                          ,lVar13 << 3);
                }
                local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[piVar22[uVar14]] = (int)uVar14;
                uVar21 = (this->super_BaseCanonicalGrid).points.indexes.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start
                         [(long)piVar22[uVar14] *
                          (this->super_BaseCanonicalGrid).points.num_dimensions + lVar17] + 1;
                iVar6 = 0;
                if (1 < uVar21) {
                  iVar6 = 0;
                  do {
                    uVar21 = (int)uVar21 >> 1;
                    iVar6 = iVar6 + 1;
                  } while (1 < uVar21);
                }
                local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14] = iVar6;
                if (local_194 <= iVar6) {
                  local_194 = iVar6;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != (uVar7 & 0x7fffffff));
              goto LAB_001a4b76;
            }
          }
          else if (0 < (int)uVar7) {
            sVar10 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            pdVar1 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar2 = (this->super_BaseCanonicalGrid).values.num_outputs;
            piVar22 = (this->super_BaseCanonicalGrid).points.indexes.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            uVar14 = 0;
            local_194 = 0;
            do {
              iVar6 = local_140[uVar14];
              local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_130 * uVar14] =
                   pdVar1[local_f8 + sVar2 * (long)iVar6];
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar6] = (int)uVar14;
              uVar21 = piVar22[lVar17 + (long)local_140[uVar14] * sVar10] + 1;
              iVar6 = 0;
              if (1 < uVar21) {
                iVar6 = 0;
                do {
                  uVar21 = (int)uVar21 >> 1;
                  iVar6 = iVar6 + 1;
                } while (1 < uVar21);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar14] = iVar6;
              if (local_194 <= iVar6) {
                local_194 = iVar6;
              }
              uVar14 = uVar14 + 1;
              local_100 = lVar13;
            } while (uVar14 != (uVar7 & 0x7fffffff));
LAB_001a4b76:
            uVar7 = (uint)local_e8;
            if (0 < local_194) {
              local_38 = (ulong)(uVar7 & 0x7fffffff);
              iVar6 = 1;
              do {
                if (0 < (int)local_e8) {
                  lVar13 = 0;
                  uVar14 = 0;
                  do {
                    pdVar1 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14] == iVar6) {
                      iVar29 = (this->super_BaseCanonicalGrid).points.indexes.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(this->super_BaseCanonicalGrid).points.num_dimensions *
                                (long)local_140[uVar14] + lVar17];
                      uVar7 = iVar29 + 1;
                      dVar25 = 1.0;
                      if (1 < uVar7) {
                        iVar11 = 1;
                        do {
                          uVar7 = (int)uVar7 >> 1;
                          iVar11 = iVar11 * 2;
                        } while (1 < uVar7);
                        dVar25 = (double)iVar11;
                      }
                      iVar11 = local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start
                               [(long)local_140[uVar14] * local_98.stride + lVar17];
                      if (iVar11 != -1) {
                        lVar8 = local_130 * lVar13;
                        do {
                          lVar19 = (long)iVar11;
                          dVar24 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                             (this->order,
                                              (this->super_BaseCanonicalGrid).points.indexes.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start
                                              [(this->super_BaseCanonicalGrid).points.num_dimensions
                                               * lVar19 + lVar17],
                                              (double)(iVar29 * 2 + 3) / dVar25 + -3.0);
                          if (0 < (int)uVar9) {
                            iVar11 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar19];
                            uVar15 = 0;
                            do {
                              *(double *)((long)pdVar1 + uVar15 * 8 + lVar8) =
                                   local_120.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [iVar11 * local_130 + uVar15] * -dVar24 +
                                   *(double *)((long)pdVar1 + uVar15 * 8 + lVar8);
                              uVar15 = uVar15 + 1;
                            } while (uVar9 != uVar15);
                          }
                          iVar11 = local_98.vec.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [lVar19 * local_98.stride + lVar17];
                        } while (iVar11 != -1);
                      }
                    }
                    uVar14 = uVar14 + 1;
                    lVar13 = lVar13 + 8;
                  } while (uVar14 != local_38);
                }
                bVar23 = iVar6 != local_194;
                uVar7 = (uint)local_e8;
                iVar6 = iVar6 + 1;
              } while (bVar23);
            }
            lVar13 = local_100;
            if (0 < (int)uVar7) {
              sVar10 = (this->surpluses).stride;
              pdVar1 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar14 = 0;
              pdVar16 = local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                lVar19 = (long)local_140[uVar14];
                lVar8 = sVar10 * lVar19;
                if (output == -1) {
                  lVar18 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                  bVar23 = true;
                  if (0 < lVar18) {
                    lVar20 = 0;
                    do {
                      if (bVar23 == false) {
                        bVar23 = false;
                      }
                      else {
                        dVar25 = (local_148 + lVar19 * local_138)[lVar20];
                        bVar23 = true;
                        if (tolerance <
                            (ABS(pdVar1[lVar8 + lVar20]) * dVar25) /
                            local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar20]) {
                          bVar23 = (dVar25 * ABS(pdVar16[lVar20])) /
                                   local_b0.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar20] <= tolerance;
                        }
                      }
                      lVar20 = lVar20 + 1;
                    } while (lVar18 != lVar20);
                  }
                }
                else {
                  dVar25 = local_148[lVar19 * local_138];
                  bVar23 = true;
                  if (tolerance <
                      (ABS(pdVar1[lVar8 + local_f8]) * dVar25) /
                      local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[local_f8]) {
                    bVar23 = (dVar25 * ABS(local_120.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start
                                           [local_130 * uVar14])) /
                             local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[local_f8] <= tolerance;
                  }
                }
                *(uint *)((long)local_150 + lVar19 * local_f0 * 4 + lVar17 * 4) = (uint)(bVar23 ^ 1)
                ;
                uVar14 = uVar14 + 1;
                pdVar16 = pdVar16 + local_130;
              } while (uVar14 != (uVar7 & 0x7fffffff));
            }
          }
          if (local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_120.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_120.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)((ulong)((long)local_70.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_70.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_70);
      if (local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_158 != (double *)0x0) {
      operator_delete(local_158,(long)local_160 - (long)local_158);
    }
    __return_storage_ptr__ = local_40;
    if (local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}